

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  undefined1 *field_00;
  string local_d8;
  undefined2 local_b8;
  undefined1 local_b6;
  undefined7 local_b5;
  undefined4 uStack_ae;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  cpp *local_38;
  
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_d8._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_38 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d8,
               (FieldDescriptor **)&local_38);
  }
  field_00 = FieldDescriptor::kTypeToCppTypeMap;
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4) == 4) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"GG","");
    UInt64ToString(__return_storage_ptr__,&local_d8,*(uint64 *)(this + 0x90));
  }
  else {
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4) != 2) {
      memset(&local_d8,0,0xa0);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_b8 = 0;
      local_b6 = 1;
      local_b5 = 0;
      uStack_ae = 0;
      local_a0 = 0;
      local_98[0] = 0;
      local_88 = 0;
      local_78 = 0;
      local_70[0] = 0;
      local_58 = 0;
      local_50[0] = 0;
      local_40 = 0;
      local_a8 = local_98;
      local_80 = local_70;
      local_60 = local_50;
      DefaultValue_abi_cxx11_
                (__return_storage_ptr__,(cpp *)&local_d8,(Options *)this,(FieldDescriptor *)field_00
                );
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0022ec7e;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"GG","");
    Int64ToString(__return_storage_ptr__,&local_d8,*(int64 *)(this + 0x90));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return __return_storage_ptr__;
  }
LAB_0022ec7e:
  operator_delete(local_d8._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString("GG", field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return UInt64ToString("GG", field->default_value_uint64());
    default:
      return DefaultValue(Options(), field);
  }
}